

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O0

void ScaleRowDown4Box_AVX2(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 *puVar5;
  undefined1 (*pauVar6) [32];
  int iVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar10 [32];
  int dst_width_local;
  uint8_t *dst_ptr_local;
  ptrdiff_t src_stride_local;
  uint8_t *src_ptr_local;
  
  auVar9 = vpcmpeqb_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
  auVar9 = vpsrlw_avx2(auVar9,0xf);
  auVar10 = vpsllw_avx2(auVar9,3);
  auVar9 = vpackuswb_avx2(auVar9,auVar9);
  do {
    auVar8 = vpmaddubsw_avx2(*(undefined1 (*) [32])src_ptr,auVar9);
    auVar2 = vpmaddubsw_avx2(*(undefined1 (*) [32])((long)src_ptr + 0x20),auVar9);
    auVar3 = vpmaddubsw_avx2(*(undefined1 (*) [32])(*(undefined1 (*) [32])src_ptr + src_stride),
                             auVar9);
    auVar4 = vpmaddubsw_avx2(*(undefined1 (*) [32])
                              (*(undefined1 (*) [32])((long)src_ptr + 0x20) + src_stride),auVar9);
    auVar8 = vpaddw_avx2(auVar8,auVar3);
    auVar2 = vpaddw_avx2(auVar2,auVar4);
    auVar3 = vpmaddubsw_avx2(*(undefined1 (*) [32])(*(undefined1 (*) [32])src_ptr + src_stride * 2),
                             auVar9);
    auVar4 = vpmaddubsw_avx2(*(undefined1 (*) [32])
                              (*(undefined1 (*) [32])((long)src_ptr + 0x20) + src_stride * 2),auVar9
                            );
    auVar8 = vpaddw_avx2(auVar8,auVar3);
    auVar2 = vpaddw_avx2(auVar2,auVar4);
    puVar5 = *(undefined1 (*) [32])src_ptr;
    pauVar6 = (undefined1 (*) [32])((long)src_ptr + 0x20);
    src_ptr = (uint8_t *)((long)src_ptr + 0x40);
    auVar3 = vpmaddubsw_avx2(*(undefined1 (*) [32])(puVar5 + src_stride * 3),auVar9);
    auVar4 = vpmaddubsw_avx2(*(undefined1 (*) [32])(*pauVar6 + src_stride * 3),auVar9);
    auVar8 = vpaddw_avx2(auVar8,auVar3);
    auVar2 = vpaddw_avx2(auVar2,auVar4);
    auVar8 = vphaddw_avx2(auVar8,auVar2);
    auVar8 = vpermq_avx2(auVar8,0xd8);
    auVar8 = vpaddw_avx2(auVar8,auVar10);
    auVar8 = vpsrlw_avx2(auVar8,4);
    auVar8 = vpackuswb_avx2(auVar8,auVar8);
    auVar8 = vpermq_avx2(auVar8,0xd8);
    *(undefined1 (*) [16])dst_ptr = auVar8._0_16_;
    dst_ptr = (uint8_t *)((long)dst_ptr + 0x10);
    iVar7 = dst_width + -0x10;
    bVar1 = 0xf < dst_width;
    dst_width = iVar7;
  } while (iVar7 != 0 && bVar1);
  return;
}

Assistant:

void ScaleRowDown4Box_AVX2(const uint8_t* src_ptr,
                           ptrdiff_t src_stride,
                           uint8_t* dst_ptr,
                           int dst_width) {
  asm volatile(
      "vpcmpeqb    %%ymm4,%%ymm4,%%ymm4          \n"
      "vpsrlw      $0xf,%%ymm4,%%ymm4            \n"
      "vpsllw      $0x3,%%ymm4,%%ymm5            \n"
      "vpackuswb   %%ymm4,%%ymm4,%%ymm4          \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "vmovdqu     0x00(%0,%3,1),%%ymm2          \n"
      "vmovdqu     0x20(%0,%3,1),%%ymm3          \n"
      "vpmaddubsw  %%ymm4,%%ymm0,%%ymm0          \n"
      "vpmaddubsw  %%ymm4,%%ymm1,%%ymm1          \n"
      "vpmaddubsw  %%ymm4,%%ymm2,%%ymm2          \n"
      "vpmaddubsw  %%ymm4,%%ymm3,%%ymm3          \n"
      "vpaddw      %%ymm2,%%ymm0,%%ymm0          \n"
      "vpaddw      %%ymm3,%%ymm1,%%ymm1          \n"
      "vmovdqu     0x00(%0,%3,2),%%ymm2          \n"
      "vmovdqu     0x20(%0,%3,2),%%ymm3          \n"
      "vpmaddubsw  %%ymm4,%%ymm2,%%ymm2          \n"
      "vpmaddubsw  %%ymm4,%%ymm3,%%ymm3          \n"
      "vpaddw      %%ymm2,%%ymm0,%%ymm0          \n"
      "vpaddw      %%ymm3,%%ymm1,%%ymm1          \n"
      "vmovdqu     0x00(%0,%4,1),%%ymm2          \n"
      "vmovdqu     0x20(%0,%4,1),%%ymm3          \n"
      "lea         0x40(%0),%0                   \n"
      "vpmaddubsw  %%ymm4,%%ymm2,%%ymm2          \n"
      "vpmaddubsw  %%ymm4,%%ymm3,%%ymm3          \n"
      "vpaddw      %%ymm2,%%ymm0,%%ymm0          \n"
      "vpaddw      %%ymm3,%%ymm1,%%ymm1          \n"
      "vphaddw     %%ymm1,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vpaddw      %%ymm5,%%ymm0,%%ymm0          \n"
      "vpsrlw      $0x4,%%ymm0,%%ymm0            \n"
      "vpackuswb   %%ymm0,%%ymm0,%%ymm0          \n"
      "vpermq      $0xd8,%%ymm0,%%ymm0           \n"
      "vmovdqu     %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src_ptr),                   // %0
        "+r"(dst_ptr),                   // %1
        "+r"(dst_width)                  // %2
      : "r"((intptr_t)(src_stride)),     // %3
        "r"((intptr_t)(src_stride * 3))  // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}